

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O2

void __thiscall calculator::Word::~Word(Word *this)

{
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__Word_001164e8;
  std::__cxx11::string::~string((string *)&this->__lexeme);
  Token::~Token(&this->super_Token);
  return;
}

Assistant:

Word(const std::string& word, bool minus = false, Tag tag = Tag::Identifier)
        : Token(tag), __lexeme(word), __minus(minus) {}